

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rasterizer-agg.cpp
# Opt level: O2

bool __thiscall RasterizerAGG::addPoly(RasterizerAGG *this,Point *poly,size_t count)

{
  AGGRasterizer *this_00;
  long lVar1;
  double *pdVar2;
  bool bVar3;
  
  if (count != 0) {
    this_00 = &this->_rasterizer;
    agg::rasterizer_scanline_aa<agg::rasterizer_sl_clip<agg::ras_conv_int>_>::move_to_d
              (this_00,poly->x,poly->y);
    lVar1 = count - 1;
    pdVar2 = &poly[1].y;
    while (bVar3 = lVar1 != 0, lVar1 = lVar1 + -1, bVar3) {
      agg::rasterizer_scanline_aa<agg::rasterizer_sl_clip<agg::ras_conv_int>_>::line_to_d
                (this_00,((Point *)(pdVar2 + -1))->x,*pdVar2);
      pdVar2 = pdVar2 + 2;
    }
    agg::rasterizer_scanline_aa<agg::rasterizer_sl_clip<agg::ras_conv_int>_>::close_polygon(this_00)
    ;
  }
  return true;
}

Assistant:

bool RasterizerAGG::addPoly(const Point* poly, size_t count) noexcept {
  if (!count)
    return true;

  _rasterizer.move_to_d(poly[0].x, poly[0].y);
  for (size_t i = 1; i < count; i++)
    _rasterizer.line_to_d(poly[i].x, poly[i].y);
  _rasterizer.close_polygon();

  return true;
}